

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void gen_wide_b64grams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  uint uVar1;
  int iVar2;
  uint __args;
  ulong uVar3;
  ulong uVar4;
  uint64_t offset;
  uint64_t uVar5;
  
  if (7 < size) {
    uVar3 = 0;
    __args = 0;
    for (uVar5 = 0; size != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = __args;
      if ((uVar3 & 1) == 0) {
        iVar2 = get_b64_value(mem[uVar5]);
        uVar3 = uVar3 | 1;
        uVar1 = __args * 0x40 + iVar2 & 0xffffff;
        if (iVar2 < 0) {
          uVar3 = 0;
          uVar1 = __args;
        }
      }
      else {
        uVar4 = uVar3 + 1;
        uVar3 = 0;
        if (mem[uVar5] == '\0') {
          uVar3 = uVar4;
        }
        if (7 < uVar3) {
          std::function<void_(unsigned_int)>::operator()(cb,__args);
          uVar3 = uVar4;
        }
      }
      __args = uVar1;
    }
  }
  return;
}

Assistant:

void gen_wide_b64grams(const uint8_t *mem, uint64_t size,
                       const TrigramCallback &cb) {
    if (size < 8) {
        return;
    }

    uint32_t gram4 = 0;
    uint64_t good_run = 0;

    for (uint64_t offset = 0; offset < size; offset++) {
        if (good_run % 2 == 1) {
            if (mem[offset] == 0) {
                good_run += 1;
            } else {
                good_run = 0;
            }

            if (good_run >= 8) {
                cb(gram4);
            }
        } else {
            int next = get_b64_value(mem[offset]);
            if (next < 0) {
                good_run = 0;
            } else {
                gram4 = ((gram4 << 6) + next) & 0xFFFFFFU;
                good_run += 1;
            }
        }
    }
}